

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O3

DdNode * Cudd_Disequality(DdManager *dd,int N,int c,DdNode **x,DdNode **y)

{
  int *piVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  DdNode *g;
  DdNode *pDVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  DdNode *n;
  int iVar27;
  bool bVar28;
  int local_148;
  DdNode *local_138;
  DdNode *local_130;
  DdNode *local_128;
  DdNode *local_120;
  
  pDVar19 = dd->one;
  pDVar10 = (DdNode *)((ulong)pDVar19 ^ 1);
  iVar18 = 1 << ((byte)N - 1 & 0x1f);
  if (N < 0) {
LAB_007e24a3:
    pDVar19 = (DdNode *)0x0;
  }
  else if (N == 0) {
    if (c == 0) {
      pDVar19 = pDVar10;
    }
  }
  else {
    iVar5 = 1 << ((byte)N & 0x1f);
    uVar20 = 1;
    if (1 - iVar5 <= c && c < iVar5) {
      uVar21 = 1;
      local_120 = (DdNode *)0x0;
      local_138 = (DdNode *)0x0;
      local_130 = (DdNode *)0x0;
      iVar5 = c + 1;
      iVar25 = c + -1;
      iVar22 = iVar18;
      local_148 = iVar18;
      do {
        bVar3 = (byte)uVar21 & 0x1f;
        iVar26 = c + -1 >> bVar3;
        iVar14 = c + 1 >> ((byte)uVar21 & 0x1f);
        iVar2 = iVar26 + 2;
        bVar28 = (uVar20 & c + 2U) != 1;
        iVar16 = iVar18;
        if (iVar2 < (int)(iVar14 + (uint)bVar28)) {
          pDVar12 = (DdNode *)(ulong)(uint)(0 >> bVar3);
          local_128 = (DdNode *)0x0;
          iVar8 = iVar18;
        }
        else {
          lVar13 = (uint)N - uVar21;
          iVar6 = 1 << ((byte)lVar13 & 0x1f);
          iVar17 = iVar14 + (uint)bVar28 + -1;
          uVar4 = (uint)bVar28;
          iVar27 = iVar14 * 2;
          iVar15 = local_148 + uVar4 * -2;
          iVar7 = c + uVar4 * -2;
          iVar23 = iVar22 + uVar4 * -2;
          local_128 = (DdNode *)0x0;
          n = (DdNode *)0x0;
          iVar24 = iVar18;
          do {
            pDVar12 = n;
            iVar8 = iVar24;
            if ((iVar17 < iVar6) && (-iVar6 < iVar17)) {
              iVar8 = uVar4 * 2 + iVar27 + -2;
              pDVar12 = pDVar19;
              if (((iVar8 <= iVar5) && (iVar25 < (int)((uint)bVar28 * 2 + -3 + iVar27))) &&
                 ((uVar21 != 1 || (pDVar12 = pDVar10, iVar7 + 3 != iVar27)))) {
                if ((iVar23 + 3 != iVar27) && (iVar15 + 3 != iVar27)) {
                  __assert_fail("leftChild == index[0] || leftChild == index[1]",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                                ,0x3ed,
                                "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar12 = local_130;
                if (iVar23 + 3 == iVar27) {
                  pDVar12 = local_138;
                }
              }
              g = pDVar19;
              if (((iVar8 < iVar5) && (iVar25 < iVar8)) &&
                 ((uVar21 != 1 || (g = pDVar10, iVar7 + 2 != iVar27)))) {
                if ((iVar23 + 2 != iVar27) && (iVar15 + 2 != iVar27)) {
                  __assert_fail("middleChild == index[0] || middleChild == index[1]",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                                ,0x3fc,
                                "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                g = local_130;
                if (iVar23 + 2 == iVar27) {
                  g = local_138;
                }
              }
              pDVar11 = pDVar19;
              if ((((int)((bVar28 - 1) + (uint)bVar28 + iVar27) < iVar5) && (iVar25 <= iVar8)) &&
                 ((uVar21 != 1 || (pDVar11 = pDVar10, iVar7 + 1 != iVar27)))) {
                if ((iVar23 + 1 != iVar27) && (iVar15 + 1 != iVar27)) {
                  __assert_fail("rightChild == index[0] || rightChild == index[1]",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                                ,0x40b,
                                "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                               );
                }
                pDVar11 = local_130;
                if (iVar23 + 1 == iVar27) {
                  pDVar11 = local_138;
                }
              }
              pDVar11 = Cudd_bddIte(dd,y[lVar13],g,pDVar11);
              if (pDVar11 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar11 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                pDVar12 = Cudd_bddIte(dd,y[lVar13],pDVar12,g);
                if (pDVar12 != (DdNode *)0x0) {
                  piVar1 = (int *)(((ulong)pDVar12 & 0xfffffffffffffffe) + 4);
                  *piVar1 = *piVar1 + 1;
                  local_120 = Cudd_bddIte(dd,x[lVar13],pDVar11,pDVar12);
                  if (local_120 != (DdNode *)0x0) {
                    piVar1 = (int *)(((ulong)local_120 & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + 1;
                    Cudd_IterDerefBdd(dd,pDVar11);
                    Cudd_IterDerefBdd(dd,pDVar12);
                    if (iVar16 != iVar18 && iVar24 != iVar18) {
                      __assert_fail("newIndex[0] == invalidIndex || newIndex[1] == invalidIndex",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/cudd/cuddPriority.c"
                                    ,0x436,
                                    "DdNode *Cudd_Disequality(DdManager *, int, int, DdNode **, DdNode **)"
                                   );
                    }
                    pDVar12 = local_120;
                    iVar8 = iVar17;
                    if (iVar24 != iVar18) {
                      pDVar12 = n;
                      iVar8 = iVar24;
                      local_128 = local_120;
                      iVar16 = iVar17;
                    }
                    goto LAB_007e232b;
                  }
                  Cudd_IterDerefBdd(dd,pDVar11);
                  pDVar11 = pDVar12;
                }
                Cudd_IterDerefBdd(dd,pDVar11);
              }
              if (iVar22 != iVar18) {
                Cudd_IterDerefBdd(dd,local_138);
              }
              if (local_148 != iVar18) {
                Cudd_IterDerefBdd(dd,local_130);
              }
              if (iVar24 != iVar18) {
                Cudd_IterDerefBdd(dd,n);
              }
              if (iVar16 != iVar18) {
                Cudd_IterDerefBdd(dd,local_128);
              }
              goto LAB_007e24a3;
            }
LAB_007e232b:
            iVar9 = iVar17 - iVar26;
            iVar17 = iVar17 + 1;
            iVar27 = iVar27 + 2;
            n = pDVar12;
            iVar24 = iVar8;
          } while (iVar9 != 1);
        }
        if (iVar22 != iVar18) {
          Cudd_IterDerefBdd(dd,local_138);
        }
        if (local_148 != iVar18) {
          Cudd_IterDerefBdd(dd,local_130);
        }
        iVar25 = iVar14 + (uint)bVar28 + -2;
        uVar20 = uVar20 * 2 + 1;
        uVar21 = uVar21 + 1;
        local_130 = local_128;
        iVar5 = iVar2;
        iVar22 = iVar8;
        local_148 = iVar16;
        local_138 = pDVar12;
      } while (uVar21 != N + 1);
      piVar1 = (int *)(((ulong)local_120 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      pDVar19 = local_120;
    }
  }
  return pDVar19;
}

Assistant:

DdNode *
Cudd_Disequality(
  DdManager * dd /* DD manager */,
  int  N /* number of x and y variables */,
  int c /* right-hand side constant */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */)
{
    /* The nodes at level i represent values of the difference that are
    ** multiples of 2^i.  We use variables with names starting with k
    ** to denote the multipliers of 2^i in such multiples. */
    int kTrueLb = c + 1;
    int kTrueUb = c - 1;
    int kFalse = c;
    /* Mask used to compute the ceiling function.  Since we divide by 2^i,
    ** we want to know whether the dividend is a multiple of 2^i.  If it is,
    ** then ceiling and floor coincide; otherwise, they differ by one. */
    int mask = 1;
    int i;

    DdNode *f = NULL;           /* the eventual result */
    DdNode *one = DD_ONE(dd);
    DdNode *zero = Cudd_Not(one);

    /* Two x-labeled nodes are created at most at each iteration.  They are
    ** stored, along with their k values, in these variables.  At each level,
    ** the old nodes are freed and the new nodes are copied into the old map.
    */
    DdNode *map[2] = {0};
    int invalidIndex = 1 << (N-1);
    int index[2] = {invalidIndex, invalidIndex};

    /* This should never happen. */
    if (N < 0) return(NULL);

    /* If there are no bits, both operands are 0.  The result depends on c. */
    if (N == 0) {
        if (c != 0) return(one);
        else return(zero);
    }

    /* The maximum or the minimum difference comparing to c can generate the terminal case */
    if ((1 << N) - 1 < c || (-(1 << N) + 1) > c) return(one);

    /* Build the result bottom up. */
    for (i = 1; i <= N; i++) {
        int kTrueLbLower, kTrueUbLower;
        int leftChild, middleChild, rightChild;
        DdNode *g0, *g1, *fplus, *fequal, *fminus;
        int j;
        DdNode *newMap[2] = {NULL};
        int newIndex[2];

        kTrueLbLower = kTrueLb;
        kTrueUbLower = kTrueUb;
        /* kTrueLb = floor((c-1)/2^i) + 2 */
        kTrueLb = ((c-1) >> i) + 2;
        /* kTrueUb = ceiling((c+1)/2^i) - 2 */
        kTrueUb = ((c+1) >> i) + (((c+2) & mask) != 1) - 2;
        mask = (mask << 1) | 1;
        newIndex[0] = invalidIndex;
        newIndex[1] = invalidIndex;

        for (j = kTrueUb + 1; j < kTrueLb; j++) {
            /* Skip if node is not reachable from top of BDD. */
            if ((j >= (1 << (N - i))) || (j <= -(1 << (N -i)))) continue;

            /* Find f- */
            leftChild = (j << 1) - 1;
            if (leftChild >= kTrueLbLower || leftChild <= kTrueUbLower) {
                fminus = one;
            } else if (i == 1 && leftChild == kFalse) {
                fminus = zero;
            } else {
                assert(leftChild == index[0] || leftChild == index[1]);
                if (leftChild == index[0]) {
                    fminus = map[0];
                } else {
                    fminus = map[1];
                }
            }

            /* Find f= */
            middleChild = j << 1;
            if (middleChild >= kTrueLbLower || middleChild <= kTrueUbLower) {
                fequal = one;
            } else if (i == 1 && middleChild == kFalse) {
                fequal = zero;
            } else {
                assert(middleChild == index[0] || middleChild == index[1]);
                if (middleChild == index[0]) {
                    fequal = map[0];
                } else {
                    fequal = map[1];
                }
            }

            /* Find f+ */
            rightChild = (j << 1) + 1;
            if (rightChild >= kTrueLbLower || rightChild <= kTrueUbLower) {
                fplus = one;
            } else if (i == 1 && rightChild == kFalse) {
                fplus = zero;
            } else {
                assert(rightChild == index[0] || rightChild == index[1]);
                if (rightChild == index[0]) {
                    fplus = map[0];
                } else {
                    fplus = map[1];
                }
            }

            /* Build new nodes. */
            g1 = Cudd_bddIte(dd, y[N - i], fequal, fplus);
            if (g1 == NULL) {
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g1);
            g0 = Cudd_bddIte(dd, y[N - i], fminus, fequal);
            if (g0 == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(g0);
            f = Cudd_bddIte(dd, x[N - i], g1, g0);
            if (f == NULL) {
                Cudd_IterDerefBdd(dd, g1);
                Cudd_IterDerefBdd(dd, g0);
                if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
                if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
                if (newIndex[0] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[0]);
                if (newIndex[1] != invalidIndex) Cudd_IterDerefBdd(dd, newMap[1]);
                return(NULL);
            }
            cuddRef(f);
            Cudd_IterDerefBdd(dd, g1);
            Cudd_IterDerefBdd(dd, g0);

            /* Save newly computed node in map. */
            assert(newIndex[0] == invalidIndex || newIndex[1] == invalidIndex);
            if (newIndex[0] == invalidIndex) {
                newIndex[0] = j;
                newMap[0] = f;
            } else {
                newIndex[1] = j;
                newMap[1] = f;
            }
        }

        /* Copy new map to map. */
        if (index[0] != invalidIndex) Cudd_IterDerefBdd(dd, map[0]);
        if (index[1] != invalidIndex) Cudd_IterDerefBdd(dd, map[1]);
        map[0] = newMap[0];
        map[1] = newMap[1];
        index[0] = newIndex[0];
        index[1] = newIndex[1];
    }

    cuddDeref(f);
    return(f);

}